

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

char * __thiscall
sentencepiece::SentencePieceText::_InternalParse
          (SentencePieceText *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  string *s;
  SentencePieceText_SentencePiece *msg;
  uint uVar5;
  char cVar6;
  uint res;
  void *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *ptr_00;
  char cVar8;
  uint uVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  float *local_58;
  InternalMetadata *local_50;
  ExtensionSet *local_48;
  ArenaStringPtr *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->pieces_).super_RepeatedPtrFieldBase;
  local_40 = &this->text_;
  local_50 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = &this->_extensions_;
  uVar9 = 0;
  local_58 = (float *)ptr;
  do {
    bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    if (bVar4) goto LAB_001e4508;
    bVar1 = *(byte *)local_58;
    res = (uint)bVar1;
    ptr_00 = (float *)((long)local_58 + 1);
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*(byte *)ptr_00 * 0x80) - 0x80;
      if ((char)*(byte *)ptr_00 < '\0') {
        pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_58,res);
        ptr_00 = (float *)pVar10.first;
        res = pVar10.second;
      }
      else {
        ptr_00 = (float *)((long)local_58 + 2);
      }
    }
    cVar8 = '\x04';
    local_58 = ptr_00;
    if (ptr_00 != (float *)0x0) {
      uVar5 = res >> 3;
      cVar6 = (char)res;
      if (uVar5 == 3) {
        if (cVar6 != '\x1d') goto LAB_001e4451;
        uVar9 = 2;
        this->score_ = *ptr_00;
        local_58 = ptr_00 + 1;
LAB_001e4446:
        cVar8 = '\x02';
      }
      else {
        if (uVar5 == 2) {
          if (cVar6 == '\x12') {
            local_58 = (float *)((long)ptr_00 + -1);
            do {
              local_58 = (float *)((long)local_58 + 1);
              pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar3 == (Rep *)0x0) {
LAB_001e43b4:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_38,(this->pieces_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_001e43c3:
                pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
                pRVar3->allocated_size = pRVar3->allocated_size + 1;
                msg = google::protobuf::Arena::
                      CreateMaybeMessage<sentencepiece::SentencePieceText_SentencePiece>
                                ((this->pieces_).super_RepeatedPtrFieldBase.arena_);
                pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
                iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
                (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                pRVar3->elements[iVar2] = msg;
              }
              else {
                iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar3->allocated_size <= iVar2) {
                  if (pRVar3->allocated_size ==
                      (this->pieces_).super_RepeatedPtrFieldBase.total_size_) goto LAB_001e43b4;
                  goto LAB_001e43c3;
                }
                (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                msg = (SentencePieceText_SentencePiece *)pRVar3->elements[iVar2];
              }
              local_58 = (float *)google::protobuf::internal::ParseContext::
                                  ParseMessage<sentencepiece::SentencePieceText_SentencePiece>
                                            (ctx,msg,(char *)local_58);
              if (local_58 == (float *)0x0) goto LAB_001e44d3;
            } while ((local_58 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                    (*(byte *)local_58 == 0x12));
            goto LAB_001e4446;
          }
LAB_001e4451:
          if (res == 0 || (res & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
            cVar8 = '\t';
            goto LAB_001e44d3;
          }
          if (res < 0x640) {
            if (((ulong)local_50->ptr_ & 1) == 0) {
              unknown = google::protobuf::internal::InternalMetadata::
                        mutable_unknown_fields_slow<std::__cxx11::string>(local_50);
            }
            else {
              unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (((ulong)local_50->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_58 = (float *)google::protobuf::internal::UnknownFieldParse
                                          (res,unknown,(char *)local_58,ctx);
          }
          else {
            local_58 = (float *)google::protobuf::internal::ExtensionSet::ParseField
                                          (local_48,(ulong)res,(char *)ptr_00,
                                           (MessageLite *)_SentencePieceText_default_instance_,
                                           local_50,ctx);
          }
        }
        else {
          if ((uVar5 != 1) || (cVar6 != '\n')) goto LAB_001e4451;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pvVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pvVar7 & 1) != 0) {
            pvVar7 = *(void **)((ulong)pvVar7 & 0xfffffffffffffffe);
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_40,pvVar7);
          local_58 = (float *)google::protobuf::internal::InlineGreedyStringParser
                                        (s,(char *)local_58,ctx);
        }
        cVar8 = (local_58 == (float *)0x0) * '\x02' + '\x02';
      }
    }
LAB_001e44d3:
  } while (cVar8 == '\x02');
  if (cVar8 == '\x04') {
    local_58 = (float *)0x0;
  }
LAB_001e4508:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar9;
  return (char *)local_58;
}

Assistant:

const char* SentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string text = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_text();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional float score = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 29)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}